

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda.c
# Opt level: O1

void feat_lda_transform(feat_t *fcb,mfcc_t ***inout_feat,uint32 nfr)

{
  uint uVar1;
  uint uVar2;
  mfcc_t *pmVar3;
  mfcc_t *pmVar4;
  void *__s;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  
  __s = __ckd_calloc__((ulong)*fcb->stream_len,4,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/lda.c"
                       ,0x91);
  if (nfr != 0) {
    uVar7 = 0;
    do {
      memset(__s,0,(ulong)*fcb->stream_len << 2);
      uVar1 = fcb->out_dim;
      if ((ulong)uVar1 != 0) {
        uVar2 = *fcb->stream_len;
        uVar5 = 0;
        do {
          if ((ulong)uVar2 != 0) {
            pmVar3 = *inout_feat[uVar7];
            pmVar4 = (*fcb->lda)[uVar5];
            fVar8 = *(float *)((long)__s + uVar5 * 4);
            uVar6 = 0;
            do {
              fVar8 = fVar8 + (float)pmVar3[uVar6] * (float)pmVar4[uVar6];
              *(float *)((long)__s + uVar5 * 4) = fVar8;
              uVar6 = uVar6 + 1;
            } while (uVar2 != uVar6);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != uVar1);
      }
      memcpy(*inout_feat[uVar7],__s,(ulong)*fcb->stream_len << 2);
      uVar7 = uVar7 + 1;
    } while (uVar7 != nfr);
  }
  ckd_free(__s);
  return;
}

Assistant:

void
feat_lda_transform(feat_t *fcb, mfcc_t ***inout_feat, uint32 nfr)
{
    mfcc_t *tmp;
    uint32 i, j, k;

    tmp = ckd_calloc(fcb->stream_len[0], sizeof(mfcc_t));
    for (i = 0; i < nfr; ++i) {
        /* Do the matrix multiplication inline here since fcb->lda
         * is transposed (eigenvectors in rows not columns). */
        /* FIXME: In the future we ought to use the BLAS. */
        memset(tmp, 0, sizeof(mfcc_t) * fcb->stream_len[0]);
        for (j = 0; j < feat_dimension(fcb); ++j) {
            for (k = 0; k < fcb->stream_len[0]; ++k) {
                tmp[j] += MFCCMUL(inout_feat[i][0][k], fcb->lda[0][j][k]);
            }
        }
        memcpy(inout_feat[i][0], tmp, fcb->stream_len[0] * sizeof(mfcc_t));
    }
    ckd_free(tmp);
}